

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void getString(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs,
              _func_void_char_ptr_char_ptr *check)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  string *psVar2;
  invalid_argument *this;
  allocator<char> local_a2;
  allocator<char> local_a1;
  long *local_a0;
  long local_98;
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  SetAttr local_60;
  
  if (*i <= argc + -2) {
    __s = argv[(long)*i + 1];
    if (check != (_func_void_char_ptr_char_ptr *)0x0) {
      (*check)(attrName,__s);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,attrName,&local_a1);
    psVar2 = (string *)operator_new(0x28);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_80,__s,&local_a2);
    Imf_3_2::TypedAttribute<std::__cxx11::string>::TypedAttribute(psVar2);
    paVar1 = &local_60.name.field_2;
    local_60.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_a0,local_98 + (long)local_a0);
    local_60.part = part;
    local_60.attr = (Attribute *)psVar2;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.name._M_dataplus._M_p,local_60.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    *i = *i + 2;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected a string");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getString (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs,
    void (*check) (const char attrName[], const char str[]) = 0)
{
    if (i > argc - 2)
        throw invalid_argument("Expected a string");

    const char* str = argv[i + 1];

    if (check) check (attrName, str);

    attrs.push_back (SetAttr (attrName, part, new StringAttribute (str)));
    i += 2;
}